

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_queue.h
# Opt level: O0

bool __thiscall
density::
function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
::try_consume_impl(function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *this)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *this_00;
  void *i_dest;
  undefined1 local_28 [8];
  consume_operation cons;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  *this_local;
  
  cons.m_control = (ControlBlock *)this;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::try_start_consume((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
                       *)local_28);
  bVar1 = density::heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)local_28);
  if (bVar1) {
    this_00 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
              ::consume_operation::complete_type((consume_operation *)local_28);
    i_dest = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::unaligned_element_ptr((consume_operation *)local_28);
    detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>::align_invoke_destroy
              (this_00,i_dest);
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::commit_nodestroy((consume_operation *)local_28);
  }
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation((consume_operation *)local_28);
  return bVar1;
}

Assistant:

bool try_consume_impl(std::true_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return true;
            }
            else
            {
                return false;
            }
        }